

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O3

Privkey * cfd::core::AdaptorUtil::ExtractSecret
                    (Privkey *__return_storage_ptr__,AdaptorSignature *adaptor_sig,
                    ByteData *signature,Pubkey *adaptor)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  uchar *adaptor_secret32;
  CfdException *this;
  value_type_conflict *__val;
  secp256k1_pubkey_conflict secp_adaptor;
  secp256k1_ecdsa_signature secp_sig;
  string local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  ByteData local_c8;
  secp256k1_pubkey_conflict local_b0;
  secp256k1_ecdsa_signature local_70;
  
  ctx = wally_get_secp_context();
  adaptor_secret32 = (uchar *)operator_new(0x20);
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = adaptor_secret32 + 0x20;
  adaptor_secret32[0] = '\0';
  adaptor_secret32[1] = '\0';
  adaptor_secret32[2] = '\0';
  adaptor_secret32[3] = '\0';
  adaptor_secret32[4] = '\0';
  adaptor_secret32[5] = '\0';
  adaptor_secret32[6] = '\0';
  adaptor_secret32[7] = '\0';
  adaptor_secret32[8] = '\0';
  adaptor_secret32[9] = '\0';
  adaptor_secret32[10] = '\0';
  adaptor_secret32[0xb] = '\0';
  adaptor_secret32[0xc] = '\0';
  adaptor_secret32[0xd] = '\0';
  adaptor_secret32[0xe] = '\0';
  adaptor_secret32[0xf] = '\0';
  adaptor_secret32[0x10] = '\0';
  adaptor_secret32[0x11] = '\0';
  adaptor_secret32[0x12] = '\0';
  adaptor_secret32[0x13] = '\0';
  adaptor_secret32[0x14] = '\0';
  adaptor_secret32[0x15] = '\0';
  adaptor_secret32[0x16] = '\0';
  adaptor_secret32[0x17] = '\0';
  adaptor_secret32[0x18] = '\0';
  adaptor_secret32[0x19] = '\0';
  adaptor_secret32[0x1a] = '\0';
  adaptor_secret32[0x1b] = '\0';
  adaptor_secret32[0x1c] = '\0';
  adaptor_secret32[0x1d] = '\0';
  adaptor_secret32[0x1e] = '\0';
  adaptor_secret32[0x1f] = '\0';
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = adaptor_secret32;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ParseSignature(&local_70,signature);
  ParsePubkey(&local_b0,adaptor);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)adaptor_sig);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_c8);
  iVar1 = secp256k1_ecdsa_adaptor_extract_secret
                    (ctx,adaptor_secret32,&local_70,(uchar *)local_100._M_dataplus._M_p,&local_b0);
  if ((uchar *)local_100._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (iVar1 == 1) {
    ByteData::ByteData((ByteData *)&local_100,&local_e0);
    Privkey::Privkey(__return_storage_ptr__,(ByteData *)&local_100,kMainnet,true);
    if ((uchar *)local_100._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"Could not extract secret.","");
  CfdException::CfdException(this,kCfdInternalError,&local_100);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey AdaptorUtil::ExtractSecret(
    const AdaptorSignature &adaptor_sig, const ByteData &signature,
    const Pubkey &adaptor) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> secret(Privkey::kPrivkeySize);
  auto secp_sig = ParseSignature(signature);
  auto secp_adaptor = ParsePubkey(adaptor);
  auto ret = secp256k1_ecdsa_adaptor_extract_secret(
      ctx, secret.data(), &secp_sig, adaptor_sig.GetData().GetBytes().data(),
      &secp_adaptor);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not extract secret.");
  }

  return Privkey(ByteData(secret));
}